

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O2

bool pbrt::RealisticCamera::IntersectSphericalElement
               (Float radius,Float zCenter,Ray *ray,Float *t,Normal3f *n)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  float fVar6;
  undefined8 uVar12;
  undefined1 auVar7 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar13 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar14 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar15 [64];
  float fVar16;
  Point3<float> PVar17;
  Vector3<float> VVar18;
  Normal3<float> NVar19;
  Float t1;
  Float t0;
  float local_54;
  float local_50;
  float local_4c;
  Tuple3<pbrt::Vector3,_float> local_48;
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  Tuple3<pbrt::Vector3,_float> local_28;
  
  auVar13 = in_register_00001204._4_56_;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = zCenter;
  PVar17 = Point3<float>::operator-(&ray->o,(Vector3<float> *)&local_48);
  auVar15._0_4_ = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar15._4_60_ = in_register_00001244;
  auVar8._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar13;
  fVar6 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar14 = auVar15._0_16_;
  fVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  _local_38 = auVar8._0_16_;
  auVar7 = vmovshdup_avx(_local_38);
  fVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar16 = auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1))
  ;
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar6)),_local_38,ZEXT416((uint)fVar1));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),_local_38,_local_38);
  auVar3 = vfmadd231ss_fma(auVar3,auVar14,ZEXT416((uint)fVar2));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
  auVar4 = vfmadd231ss_fma(auVar4,auVar14,auVar14);
  auVar4 = vfnmadd231ss_fma(auVar4,ZEXT416((uint)radius),ZEXT416((uint)radius));
  local_4c = auVar15._0_4_;
  bVar5 = Quadratic(auVar7._0_4_,auVar3._0_4_ + auVar3._0_4_,auVar4._0_4_,&local_50,&local_54);
  if (bVar5) {
    if (radius < 0.0 == 0.0 < (ray->d).super_Tuple3<pbrt::Vector3,_float>.z) {
      auVar7 = vmaxss_avx(ZEXT416((uint)local_54),ZEXT416((uint)local_50));
    }
    else {
      auVar7 = vminss_avx(ZEXT416((uint)local_54),ZEXT416((uint)local_50));
    }
    uVar12 = auVar7._8_8_;
    fVar6 = auVar7._0_4_;
    *t = fVar6;
    if (0.0 <= fVar6) {
      VVar18 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)&ray->d,fVar6);
      auVar7._0_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.x + (float)local_38._0_4_;
      auVar7._4_4_ = VVar18.super_Tuple3<pbrt::Vector3,_float>.y + (float)local_38._4_4_;
      auVar7._8_4_ = (float)uVar12 + fStack_30;
      auVar7._12_4_ = (float)((ulong)uVar12 >> 0x20) + fStack_2c;
      auVar13 = ZEXT856(auVar7._8_8_);
      uVar12 = vmovlps_avx(auVar7);
      (n->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar12;
      (n->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar12 >> 0x20);
      (n->super_Tuple3<pbrt::Normal3,_float>).z =
           VVar18.super_Tuple3<pbrt::Vector3,_float>.z + local_4c;
      NVar19 = Normalize<float>(n);
      local_48.z = NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar9._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar9._8_56_ = auVar13;
      local_48._0_8_ = vmovlps_avx(auVar9._0_16_);
      VVar18 = Tuple3<pbrt::Vector3,_float>::operator-(&(ray->d).super_Tuple3<pbrt::Vector3,_float>)
      ;
      local_28.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar13;
      local_28._0_8_ = vmovlps_avx(auVar10._0_16_);
      NVar19 = FaceForward<float>((Normal3<float> *)&local_48,(Vector3<float> *)&local_28);
      auVar11._0_8_ = NVar19.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar11._8_56_ = auVar13;
      uVar12 = vmovlps_avx(auVar11._0_16_);
      (n->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar12;
      (n->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar12 >> 0x20);
      (n->super_Tuple3<pbrt::Normal3,_float>).z = NVar19.super_Tuple3<pbrt::Normal3,_float>.z;
      return true;
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    static bool IntersectSphericalElement(Float radius, Float zCenter, const Ray &ray,
                                          Float *t, Normal3f *n) {
        // Compute _t0_ and _t1_ for ray--element intersection
        Point3f o = ray.o - Vector3f(0, 0, zCenter);
        Float A = ray.d.x * ray.d.x + ray.d.y * ray.d.y + ray.d.z * ray.d.z;
        Float B = 2 * (ray.d.x * o.x + ray.d.y * o.y + ray.d.z * o.z);
        Float C = o.x * o.x + o.y * o.y + o.z * o.z - radius * radius;
        Float t0, t1;
        if (!Quadratic(A, B, C, &t0, &t1))
            return false;

        // Select intersection $t$ based on ray direction and element curvature
        bool useCloserT = (ray.d.z > 0) ^ (radius < 0);
        *t = useCloserT ? std::min(t0, t1) : std::max(t0, t1);
        if (*t < 0)
            return false;

        // Compute surface normal of element at ray intersection point
        *n = Normal3f(Vector3f(o + *t * ray.d));
        *n = FaceForward(Normalize(*n), -ray.d);

        return true;
    }